

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O2

void sei_dump_messages(sei_message_t *head,double timestamp)

{
  ulong uVar1;
  libcaption_stauts_t lVar2;
  ulong uVar3;
  cea708_t cea708;
  
  cea708_init(&cea708,timestamp);
  for (; head != (sei_message_t *)0x0; head = head->next) {
    uVar1 = head->size;
    fprintf(_stderr,"-- Message %p\n-- Message Type: %d\n-- Message Size: %d\n",head + 1,
            (ulong)head->type,uVar1 & 0xffffffff);
    for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
      fprintf(_stderr,"%02X ",(ulong)*(byte *)((long)&head[1].size + uVar3));
    }
    fputc(10,_stderr);
    if (head->type == sei_type_user_data_registered_itu_t_t35) {
      lVar2 = cea708_parse_h262((uint8_t *)(head + 1),head->size,&cea708);
      if (lVar2 == LIBCAPTION_OK) {
        cea708_dump(&cea708);
      }
      else {
        fwrite("cea708_parse error\n",0x13,1,_stderr);
      }
    }
  }
  return;
}

Assistant:

void sei_dump_messages(sei_message_t* head, double timestamp)
{
    cea708_t cea708;
    sei_message_t* msg;
    cea708_init(&cea708, timestamp);

    for (msg = head; msg; msg = sei_message_next(msg)) {
        uint8_t* data = sei_message_data(msg);
        size_t size = sei_message_size(msg);
        fprintf(stderr, "-- Message %p\n-- Message Type: %d\n-- Message Size: %d\n", data, sei_message_type(msg), (int)size);

        while (size) {
            fprintf(stderr, "%02X ", *data);
            ++data;
            --size;
        }

        fprintf(stderr, "\n");

        if (sei_type_user_data_registered_itu_t_t35 == sei_message_type(msg)) {
            if (LIBCAPTION_OK != cea708_parse_h262(sei_message_data(msg), sei_message_size(msg), &cea708)) {
                fprintf(stderr, "cea708_parse error\n");
            } else {
                cea708_dump(&cea708);
            }
        }
    }
}